

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_leaflist_free(ly_ctx *ctx,lys_node_leaflist *llist,
                      _func_void_lys_node_ptr_void_ptr *private_destructor)

{
  int local_24;
  int i;
  _func_void_lys_node_ptr_void_ptr *private_destructor_local;
  lys_node_leaflist *llist_local;
  ly_ctx *ctx_local;
  
  if (llist->backlinks != (ly_set *)0x0) {
    ly_set_free(llist->backlinks);
  }
  for (local_24 = 0; local_24 < (int)(uint)llist->must_size; local_24 = local_24 + 1) {
    lys_restr_free(ctx,llist->must + local_24,private_destructor);
  }
  free(llist->must);
  for (local_24 = 0; local_24 < (int)(uint)llist->dflt_size; local_24 = local_24 + 1) {
    lydict_remove(ctx,llist->dflt[local_24]);
  }
  free(llist->dflt);
  lys_when_free(ctx,llist->when,private_destructor);
  lys_type_free(ctx,&llist->type,private_destructor);
  lydict_remove(ctx,llist->units);
  return;
}

Assistant:

static void
lys_leaflist_free(struct ly_ctx *ctx, struct lys_node_leaflist *llist,
                  void (*private_destructor)(const struct lys_node *node, void *priv))
{
    int i;

    if (llist->backlinks) {
        /* leafref backlinks */
        ly_set_free(llist->backlinks);
    }

    for (i = 0; i < llist->must_size; i++) {
        lys_restr_free(ctx, &llist->must[i], private_destructor);
    }
    free(llist->must);

    for (i = 0; i < llist->dflt_size; i++) {
        lydict_remove(ctx, llist->dflt[i]);
    }
    free(llist->dflt);

    lys_when_free(ctx, llist->when, private_destructor);

    lys_type_free(ctx, &llist->type, private_destructor);
    lydict_remove(ctx, llist->units);
}